

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetInternalDepfileName
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,string *param_1,
          string *depfile)

{
  string_view input;
  cmGlobalGenerator *pcVar1;
  undefined4 extraout_var;
  cmDepfileFormat *pcVar2;
  string *str;
  string local_f0;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  _Optional_payload_base<cmDepfileFormat> local_60;
  undefined1 local_58 [8];
  string extension;
  cmCryptoHash hash;
  string *depfile_local;
  string *param_1_local;
  cmCustomCommandGenerator *this_local;
  
  cmCryptoHash::cmCryptoHash((cmCryptoHash *)((long)&extension.field_2 + 8),AlgoSHA256);
  std::__cxx11::string::string((string *)local_58);
  pcVar1 = cmLocalGenerator::GetGlobalGenerator(this->LG);
  local_60._M_payload._M_value = (*pcVar1->_vptr_cmGlobalGenerator[0x32])();
  local_60._4_4_ = extraout_var;
  pcVar2 = std::optional<cmDepfileFormat>::operator*((optional<cmDepfileFormat> *)&local_60);
  if (*pcVar2 < MSBuildAdditionalInputs) {
    std::__cxx11::string::operator=((string *)local_58,".d");
  }
  else if (*pcVar2 == MSBuildAdditionalInputs) {
    std::__cxx11::string::operator=((string *)local_58,".AdditionalInputs");
  }
  str = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this->LG);
  cmAlphaNum::cmAlphaNum(&local_a0,str);
  cmAlphaNum::cmAlphaNum(&local_d0,"/CMakeFiles/d/");
  input = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)depfile);
  cmCryptoHash::HashString_abi_cxx11_
            (&local_f0,(cmCryptoHash *)((long)&extension.field_2 + 8),input);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,&local_a0,&local_d0,&local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_58);
  cmCryptoHash::~cmCryptoHash((cmCryptoHash *)((long)&extension.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetInternalDepfileName(
  const std::string& /*config*/, const std::string& depfile)
{
  cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
  std::string extension;
  switch (*this->LG->GetGlobalGenerator()->DepfileFormat()) {
    case cmDepfileFormat::GccDepfile:
    case cmDepfileFormat::MakeDepfile:
      extension = ".d";
      break;
    case cmDepfileFormat::MSBuildAdditionalInputs:
      extension = ".AdditionalInputs";
      break;
  }
  return cmStrCat(this->LG->GetBinaryDirectory(), "/CMakeFiles/d/",
                  hash.HashString(depfile), extension);
}